

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryScatter<duckdb::ArgMinMaxState<duckdb::date_t,int>,duckdb::date_t,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,Vector *states,idx_t count)

{
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat(a,count,&adata);
  Vector::ToUnifiedFormat(b,count,&bdata);
  Vector::ToUnifiedFormat(states,count,&sdata);
  BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::date_t,int>,duckdb::date_t,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
            ((date_t *)adata.data,aggr_input_data,(int *)bdata.data,
             (ArgMinMaxState<duckdb::date_t,_int> **)sdata.data,count,adata.sel,bdata.sel,sdata.sel,
             &adata.validity,&bdata.validity);
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void BinaryScatter(AggregateInputData &aggr_input_data, Vector &a, Vector &b, Vector &states, idx_t count) {
		UnifiedVectorFormat adata, bdata, sdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		states.ToUnifiedFormat(count, sdata);

		BinaryScatterLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE **)sdata.data, count, *adata.sel, *bdata.sel, *sdata.sel, adata.validity, bdata.validity);
	}